

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall dynamicgraph::Entity::addCommand(Entity *this,string *inName,Command *command)

{
  size_type sVar1;
  ExceptionFactory *this_00;
  undefined1 local_a0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
  item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ErrorCodeEnum local_24;
  Command *local_20;
  Command *command_local;
  string *inName_local;
  Entity *this_local;
  
  local_20 = command;
  command_local = (Command *)inName;
  inName_local = (string *)this;
  sVar1 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>_>_>
          ::count(&this->commandMap,inName);
  if (sVar1 != 0) {
    item.second._3_1_ = 1;
    this_00 = (ExceptionFactory *)__cxa_allocate_exception(0x30);
    local_24 = OBJECT_CONFLICT;
    std::operator+(&local_68,"Command ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   command_local);
    std::operator+(&local_48,&local_68," already registered in Entity.");
    ExceptionFactory::ExceptionFactory(this_00,&local_24,&local_48);
    item.second._3_1_ = 0;
    __cxa_throw(this_00,&ExceptionFactory::typeinfo,ExceptionFactory::~ExceptionFactory);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
  ::pair<dynamicgraph::command::Command_*&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
              *)local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)command_local,
             &local_20);
  std::
  map<std::__cxx11::string_const,dynamicgraph::command::Command*,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>>
  ::insert<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>&>
            ((map<std::__cxx11::string_const,dynamicgraph::command::Command*,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>>
              *)&this->commandMap,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
              *)local_a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
           *)local_a0);
  return;
}

Assistant:

void Entity::addCommand(const std::string &inName, Command *command) {
  if (commandMap.count(inName) != 0) {
    DG_THROW ExceptionFactory(
        ExceptionFactory::OBJECT_CONFLICT,
        "Command " + inName + " already registered in Entity.");
  }
  std::pair<const std::string, Command *> item(inName, command);
  commandMap.insert(item);
}